

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::setSegmentSize
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr size)

{
  long lVar1;
  char *errorMessage;
  char *end;
  char *local_20;
  
  if (this->flat == true) {
    errorMessage = "cannot be used with --flat";
  }
  else {
    lVar1 = strtol(size.content.ptr,&local_20,0);
    this->segmentSize = (uint)lVar1;
    if ((size.content.size_ != 1) && (*local_20 == '\0')) {
      (__return_storage_ptr__->errorMessage).ptr.isSet = false;
      return __return_storage_ptr__;
    }
    errorMessage = "not an integer";
  }
  kj::MainBuilder::Validity::Validity(__return_storage_ptr__,errorMessage);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setSegmentSize(kj::StringPtr size) {
    if (flat) return "cannot be used with --flat";
    char* end;
    segmentSize = strtol(size.cStr(), &end, 0);
    if (size.size() == 0 || *end != '\0') {
      return "not an integer";
    }
    return true;
  }